

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  my_options_t *options_00;
  my_options_t *options;
  char **argv_local;
  int argc_local;
  
  options_00 = my_program_options_get(argc,argv);
  if (options_00->success != 0) {
    print_options(options_00);
    exit(0);
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{

    my_options_t* options = my_program_options_get(argc, argv);
    if (options->success)
    {
        print_options(options);
        exit(EXIT_SUCCESS);
    }
    else
    {
        exit(EXIT_FAILURE);
    }
}